

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaB_error(lua_State *L)

{
  StkId pTVar1;
  lua_Integer lVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  TValue *pTVar5;
  bool bVar6;
  
  lVar2 = luaL_optinteger(L,2,1);
  pTVar5 = L->base;
  pTVar3 = L->top;
  if (L->top < pTVar5 + 1) {
    do {
      pTVar3->tt = 0;
      pTVar4 = pTVar3 + 1;
      bVar6 = pTVar3 < pTVar5;
      pTVar3 = pTVar4;
    } while (bVar6);
    L->top = pTVar4;
  }
  L->top = pTVar5 + 1;
  if (pTVar5 == &luaO_nilobject_) {
    bVar6 = false;
  }
  else {
    bVar6 = pTVar5->tt - 3U < 2;
  }
  if ((bool)(0 < (int)lVar2 & bVar6)) {
    luaL_where(L,(int)lVar2);
    pTVar1 = L->top;
    pTVar5 = &luaO_nilobject_;
    if (L->base < pTVar1) {
      pTVar5 = L->base;
    }
    pTVar1->value = pTVar5->value;
    pTVar1->tt = pTVar5->tt;
    L->top = L->top + 1;
    lua_concat(L,2);
  }
  luaG_errormsg(L);
}

Assistant:

static int luaB_error(lua_State*L){
int level=luaL_optint(L,2,1);
lua_settop(L,1);
if(lua_isstring(L,1)&&level>0){
luaL_where(L,level);
lua_pushvalue(L,1);
lua_concat(L,2);
}
return lua_error(L);
}